

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O1

void ncnn::crop_pack16_avx512(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  int iVar12;
  undefined8 *puVar13;
  int iVar14;
  
  iVar1 = dst->h;
  if (0 < iVar1) {
    iVar2 = dst->w;
    puVar13 = (undefined8 *)dst->data;
    iVar3 = src->w;
    puVar11 = (undefined8 *)
              ((long)src->data + (long)(left << 4) * 4 + (long)top * (long)iVar3 * src->elemsize);
    iVar12 = 0;
    do {
      iVar14 = iVar2;
      if (0 < iVar2) {
        do {
          uVar4 = puVar11[1];
          uVar5 = puVar11[2];
          uVar6 = puVar11[3];
          uVar7 = puVar11[4];
          uVar8 = puVar11[5];
          uVar9 = puVar11[6];
          uVar10 = puVar11[7];
          *puVar13 = *puVar11;
          puVar13[1] = uVar4;
          puVar13[2] = uVar5;
          puVar13[3] = uVar6;
          puVar13[4] = uVar7;
          puVar13[5] = uVar8;
          puVar13[6] = uVar9;
          puVar13[7] = uVar10;
          puVar11 = puVar11 + 8;
          puVar13 = puVar13 + 8;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      puVar11 = puVar11 + ((long)iVar3 - (long)iVar2) * 8;
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar1);
  }
  return;
}

Assistant:

static void crop_pack16_avx512(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 16;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }

        ptr += (left + right) * 16;
    }
}